

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_device_collection_destroy(cubeb_conflict *ctx,cubeb_device_collection *collection)

{
  long *in_RSI;
  size_t n;
  ulong local_18;
  
  for (local_18 = 0; local_18 < (ulong)in_RSI[1]; local_18 = local_18 + 1) {
    free(*(void **)(*in_RSI + local_18 * 0x58 + 0x10));
    free(*(void **)(*in_RSI + local_18 * 0x58 + 0x20));
    free(*(void **)(*in_RSI + local_18 * 0x58 + 0x18));
  }
  free((void *)*in_RSI);
  return 0;
}

Assistant:

static int
pulse_device_collection_destroy(cubeb * ctx,
                                cubeb_device_collection * collection)
{
  size_t n;

  for (n = 0; n < collection->count; n++) {
    free((void *)collection->device[n].friendly_name);
    free((void *)collection->device[n].vendor_name);
    free((void *)collection->device[n].group_id);
  }

  free(collection->device);
  return CUBEB_OK;
}